

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::
DecodeAttributeConnectivitiesOnFace
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          CornerIndex corner)

{
  uint uVar1;
  iterator iVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  pointer pAVar6;
  ulong uVar7;
  uint uVar8;
  int c;
  long lVar9;
  undefined4 in_register_00000034;
  CornerIndex corners [3];
  uint local_50;
  uint local_4c [3];
  ulong local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,corner.value_);
  local_4c[0] = corner.value_;
  local_4c[1] = corner.value_;
  if (corner.value_ != 0xffffffff) {
    local_4c[1] = corner.value_ - 2;
    if (0x55555555 < (corner.value_ + 1) * -0x55555555) {
      local_4c[1] = corner.value_ + 1;
    }
  }
  local_40 = (ulong)corner.value_ / 3;
  lVar9 = 0;
  local_4c[2] = ((corner.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner.value_;
  if (corner.value_ == 0xffffffff) {
    local_4c[2] = -1;
  }
  do {
    uVar1 = local_4c[lVar9];
    uVar8 = uVar1;
    if ((ulong)uVar1 != 0xffffffff) {
      uVar8 = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                    super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl
                                   )->opposite_corners_).vector_.
                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       + (ulong)uVar1 * 4);
    }
    if (uVar8 == 0xffffffff) {
      pAVar6 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->attribute_data_).
          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
          ._M_impl.super__Vector_impl_data._M_finish != pAVar6) {
        uVar7 = 0;
        uVar5 = 1;
        do {
          iVar2._M_current =
               pAVar6[uVar7].attribute_seam_corners.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              pAVar6[uVar7].attribute_seam_corners.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_50 = uVar1;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&pAVar6[uVar7].attribute_seam_corners,iVar2,(int *)&local_50);
          }
          else {
            *iVar2._M_current = uVar1;
            pAVar6[uVar7].attribute_seam_corners.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            local_50 = uVar1;
          }
          pAVar6 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(this->attribute_data_).
                         super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 6) *
                  -0x3333333333333333;
          bVar4 = uVar5 <= uVar7;
          lVar3 = uVar7 - uVar5;
          uVar7 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar4 && lVar3 != 0);
      }
    }
    else if ((((int)local_38 != -1) && ((uint)local_40 <= uVar8 / 3)) &&
            ((this->attribute_data_).
             super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             (this->attribute_data_).
             super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start)) {
      uVar8 = 1;
      uVar7 = 0;
      do {
        bVar4 = RAnsBitDecoder::DecodeNextBit
                          ((this->traversal_decoder_).attribute_connectivity_decoders_._M_t.
                           super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
                           .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl +
                           (int)(uVar8 - 1));
        if (bVar4) {
          pAVar6 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar2._M_current =
               *(pointer *)
                ((long)&pAVar6[uVar7].attribute_seam_corners.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
          if (iVar2._M_current ==
              *(pointer *)
               ((long)&pAVar6[uVar7].attribute_seam_corners.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10)) {
            local_50 = uVar1;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&pAVar6[uVar7].attribute_seam_corners,iVar2,(int *)&local_50);
          }
          else {
            *iVar2._M_current = uVar1;
            *(int **)((long)&pAVar6[uVar7].attribute_seam_corners.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
                 iVar2._M_current + 1;
            local_50 = uVar1;
          }
        }
        uVar7 = (ulong)uVar8;
        uVar5 = ((long)(this->attribute_data_).
                       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->attribute_data_).
                       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x3333333333333333;
        uVar8 = uVar8 + 1;
      } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  return true;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<
    TraversalDecoder>::DecodeAttributeConnectivitiesOnFace(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  const FaceIndex src_face_id = corner_table_->Face(corner);
  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      // Don't decode attribute seams on boundary edges (every boundary edge
      // is automatically an attribute seam).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
      continue;
    }
    const FaceIndex opp_face_id = corner_table_->Face(opp_corner);
    // Don't decode edges when the opposite face has been already processed.
    if (opp_face_id < src_face_id) {
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      const bool is_seam = traversal_decoder_.DecodeAttributeSeam(i);
      if (is_seam) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
    }
  }
  return true;
}